

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_wiener_denoise_2d
              (uint8_t **data,uint8_t **denoised,int w,int h,int *stride,int *chroma_sub,
              float **noise_psd,int block_size,int bit_depth,int use_highbd)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int *in_R9;
  int iVar5;
  float block_normalization;
  long in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  int in_stack_00000020;
  int x_result;
  int x;
  int y_result;
  int y;
  int j;
  int pixels_per_block;
  int bx;
  int by;
  int offsx;
  int offsy;
  aom_noise_tx_t *tx;
  int chroma_sub_w;
  int chroma_sub_h;
  aom_flat_block_finder_t *block_finder;
  float *window_function;
  int c;
  float kBlockNormalization;
  aom_flat_block_finder_t block_finder_chroma;
  aom_flat_block_finder_t block_finder_full;
  int init_success;
  float *result;
  int result_height;
  int result_stride;
  int num_blocks_h;
  int num_blocks_w;
  aom_noise_tx_t *tx_chroma;
  aom_noise_tx_t *tx_full;
  double *plane_d;
  double *block_d;
  float *window_chroma;
  float *window_full;
  float *block;
  float *plane;
  undefined4 in_stack_fffffffffffffe7c;
  aom_noise_tx_t *in_stack_fffffffffffffe80;
  undefined4 uVar6;
  undefined8 in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  aom_noise_tx_t *local_150;
  int local_148;
  int local_144;
  aom_flat_block_finder_t *local_140;
  bool local_131;
  int local_12c;
  int local_124;
  int local_120;
  int local_118;
  int in_stack_fffffffffffffeec;
  int iVar7;
  int in_stack_fffffffffffffef0;
  int iVar8;
  int in_stack_fffffffffffffef4;
  aom_flat_block_finder_t *in_stack_fffffffffffffef8;
  uint8_t *data_00;
  int local_e8;
  int in_stack_ffffffffffffff20;
  double *in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff30;
  uint8_t local_b8 [44];
  uint local_8c;
  float *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  aom_noise_tx_t *local_70;
  aom_noise_tx_t *local_68;
  aom_noise_tx_t *local_60;
  void *local_58;
  aom_flat_block_finder_t *local_50;
  aom_flat_block_finder_t *local_48;
  float *local_40;
  float *local_38;
  int *local_30;
  long local_28;
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  uint local_4;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_38 = (float *)0x0;
  local_40 = (float *)0x0;
  local_48 = (aom_flat_block_finder_t *)0x0;
  local_50 = (aom_flat_block_finder_t *)0x0;
  local_58 = (void *)0x0;
  local_60 = (aom_noise_tx_t *)0x0;
  local_68 = (aom_noise_tx_t *)0x0;
  local_70 = (aom_noise_tx_t *)0x0;
  local_74 = (in_EDX + in_stack_00000010 + -1) / in_stack_00000010;
  iVar1 = in_ECX + in_stack_00000010 + -1;
  local_78 = iVar1 / in_stack_00000010;
  local_7c = (local_74 + 2) * in_stack_00000010;
  local_80 = (local_78 + 2) * in_stack_00000010;
  local_88 = (float *)0x0;
  local_8c = 1;
  block_normalization = (float)((1 << (in_stack_00000018 & 0x1f)) + -1);
  if (*in_R9 == in_R9[1]) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_ECX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    uVar2 = aom_flat_block_finder_init
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                       ,in_stack_fffffffffffffeec);
    local_8c = uVar2 & local_8c;
    local_88 = (float *)aom_malloc(0x3bbece);
    local_38 = (float *)aom_malloc(0x3bbef1);
    local_40 = (float *)aom_memalign(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                     in_stack_fffffffffffffe90);
    local_58 = aom_malloc(0x3bbf3e);
    local_60 = (aom_noise_tx_t *)aom_malloc(0x3bbf61);
    local_48 = (aom_flat_block_finder_t *)get_half_cos_window(in_stack_fffffffffffffe9c);
    local_68 = aom_noise_tx_malloc(iVar8);
    if (*local_30 == 0) {
      local_50 = local_48;
      local_70 = local_68;
    }
    else {
      uVar2 = aom_flat_block_finder_init
                        (in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                         in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      local_8c = uVar2 & local_8c;
      local_50 = (aom_flat_block_finder_t *)get_half_cos_window(in_stack_fffffffffffffe9c);
      local_70 = aom_noise_tx_malloc(iVar8);
    }
    local_131 = false;
    if (((((local_68 != (aom_noise_tx_t *)0x0) &&
          (local_131 = false, local_70 != (aom_noise_tx_t *)0x0)) &&
         (local_131 = false, local_38 != (float *)0x0)) &&
        ((local_131 = false, local_60 != (aom_noise_tx_t *)0x0 &&
         (local_131 = false, local_40 != (float *)0x0)))) &&
       ((local_131 = false, local_58 != (void *)0x0 &&
        ((local_131 = false, local_48 != (aom_flat_block_finder_t *)0x0 &&
         (local_131 = false, local_50 != (aom_flat_block_finder_t *)0x0)))))) {
      local_131 = local_88 != (float *)0x0;
    }
    local_8c = local_131 & local_8c;
    local_e8 = 3;
    if (local_8c != 0) {
      local_e8 = 0;
    }
    for (; local_e8 < 3; local_e8 = local_e8 + 1) {
      if (local_e8 == 0) {
        local_140 = local_48;
      }
      else {
        local_140 = local_50;
      }
      data_00 = local_b8;
      if (local_e8 < 1) {
        local_144 = 0;
        local_148 = 0;
LAB_003bc1dc:
        local_150 = local_68;
      }
      else {
        local_144 = local_30[1];
        local_148 = *local_30;
        if (*local_30 < 1) goto LAB_003bc1dc;
        local_150 = local_70;
      }
      if ((*(long *)(local_10 + (long)local_e8 * 8) != 0) &&
         (*(long *)(local_18 + (long)local_e8 * 8) != 0)) {
        if ((0 < local_e8) && (*local_30 != 0)) {
          data_00 = &stack0xffffffffffffff20;
        }
        memset(local_88,0,(long)local_7c * 4 * (long)local_80);
        for (iVar1 = 0; iVar1 < in_stack_00000010 >> ((byte)local_144 & 0x1f);
            iVar1 = (in_stack_00000010 >> ((byte)local_144 & 0x1f)) / 2 + iVar1) {
          for (iVar8 = 0; iVar8 < in_stack_00000010 >> ((byte)local_148 & 0x1f);
              iVar8 = (in_stack_00000010 >> ((byte)local_148 & 0x1f)) / 2 + iVar8) {
            for (iVar7 = -1; iVar7 < local_78; iVar7 = iVar7 + 1) {
              for (local_118 = -1; local_118 < local_74; local_118 = local_118 + 1) {
                iVar3 = (in_stack_00000010 >> ((byte)local_148 & 0x1f)) *
                        (in_stack_00000010 >> ((byte)local_144 & 0x1f));
                iVar5 = iVar7 * (in_stack_00000010 >> ((byte)local_144 & 0x1f)) + iVar1;
                in_stack_fffffffffffffe80 = local_60;
                aom_flat_block_finder_extract_block
                          (local_140,data_00,local_144,local_148,(int)((ulong)local_150 >> 0x20),
                           (int)local_150,in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                           in_stack_ffffffffffffff30);
                for (local_120 = 0; local_120 < iVar3; local_120 = local_120 + 1) {
                  local_40[local_120] = (float)*(double *)((long)local_58 + (long)local_120 * 8);
                  local_38[local_120] = (float)(double)(&local_60->tx_block)[local_120];
                }
                pointwise_multiply((float *)local_140,local_40,iVar3);
                aom_noise_tx_forward
                          (in_stack_fffffffffffffe80,
                           (float *)CONCAT44(in_stack_fffffffffffffe7c,iVar5));
                aom_noise_tx_filter(local_150,*(float **)(in_stack_00000008 + (long)local_e8 * 8));
                aom_noise_tx_inverse
                          (in_stack_fffffffffffffe80,
                           (float *)CONCAT44(in_stack_fffffffffffffe7c,iVar5));
                pointwise_multiply((float *)local_140,local_38,iVar3);
                for (local_124 = 0; local_124 < in_stack_00000010 >> ((byte)local_144 & 0x1f);
                    local_124 = local_124 + 1) {
                  for (local_12c = 0; bVar4 = (byte)local_148,
                      local_12c < in_stack_00000010 >> (bVar4 & 0x1f); local_12c = local_12c + 1) {
                    iVar3 = (local_124 +
                             (iVar7 + 1) * (in_stack_00000010 >> ((byte)local_144 & 0x1f)) + iVar1)
                            * local_7c +
                            local_12c + (local_118 + 1) * (in_stack_00000010 >> (bVar4 & 0x1f)) +
                            iVar8;
                    local_88[iVar3] =
                         (local_40[local_124 * (in_stack_00000010 >> (bVar4 & 0x1f)) + local_12c] +
                         local_38[local_124 * (in_stack_00000010 >> (bVar4 & 0x1f)) + local_12c]) *
                         *(float *)((long)&local_140->AtA_inv +
                                   (long)(local_124 * (in_stack_00000010 >> (bVar4 & 0x1f)) +
                                         local_12c) * 4) + local_88[iVar3];
                  }
                }
              }
            }
          }
        }
        uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe80 >> 0x20);
        if (in_stack_00000020 == 0) {
          in_stack_fffffffffffffe80 = (aom_noise_tx_t *)CONCAT44(uVar6,local_144);
          dither_and_quantize_lowbd
                    (local_88,local_7c,*(uint8_t **)(local_18 + (long)local_e8 * 8),local_1c,
                     local_20,*(int *)(local_28 + (long)local_e8 * 4),local_148,local_144,
                     in_stack_00000010,block_normalization);
        }
        else {
          in_stack_fffffffffffffe80 = (aom_noise_tx_t *)CONCAT44(uVar6,local_144);
          dither_and_quantize_highbd
                    (local_88,local_7c,*(uint16_t **)(local_18 + (long)local_e8 * 8),local_1c,
                     local_20,*(int *)(local_28 + (long)local_e8 * 4),local_148,local_144,
                     in_stack_00000010,block_normalization);
        }
      }
    }
    aom_free(in_stack_fffffffffffffe80);
    aom_free(in_stack_fffffffffffffe80);
    aom_free(in_stack_fffffffffffffe80);
    aom_free(in_stack_fffffffffffffe80);
    aom_free(in_stack_fffffffffffffe80);
    aom_free(in_stack_fffffffffffffe80);
    aom_noise_tx_free((aom_noise_tx_t *)0x3bc836);
    aom_flat_block_finder_free((aom_flat_block_finder_t *)0x3bc843);
    if (*local_30 != 0) {
      aom_flat_block_finder_free((aom_flat_block_finder_t *)0x3bc85d);
      aom_free(in_stack_fffffffffffffe80);
      aom_noise_tx_free((aom_noise_tx_t *)0x3bc877);
    }
    local_4 = local_8c;
  }
  else {
    fprintf(_stderr,"aom_wiener_denoise_2d doesn\'t handle different chroma subsampling\n",
            (long)iVar1 % (long)in_stack_00000010 & 0xffffffff);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int aom_wiener_denoise_2d(const uint8_t *const data[3], uint8_t *denoised[3],
                          int w, int h, int stride[3], int chroma_sub[2],
                          float *noise_psd[3], int block_size, int bit_depth,
                          int use_highbd) {
  float *plane = NULL, *block = NULL, *window_full = NULL,
        *window_chroma = NULL;
  double *block_d = NULL, *plane_d = NULL;
  struct aom_noise_tx_t *tx_full = NULL;
  struct aom_noise_tx_t *tx_chroma = NULL;
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  const int result_stride = (num_blocks_w + 2) * block_size;
  const int result_height = (num_blocks_h + 2) * block_size;
  float *result = NULL;
  int init_success = 1;
  aom_flat_block_finder_t block_finder_full;
  aom_flat_block_finder_t block_finder_chroma;
  const float kBlockNormalization = (float)((1 << bit_depth) - 1);
  if (chroma_sub[0] != chroma_sub[1]) {
    fprintf(stderr,
            "aom_wiener_denoise_2d doesn't handle different chroma "
            "subsampling\n");
    return 0;
  }
  init_success &= aom_flat_block_finder_init(&block_finder_full, block_size,
                                             bit_depth, use_highbd);
  result = (float *)aom_malloc((num_blocks_h + 2) * block_size * result_stride *
                               sizeof(*result));
  plane = (float *)aom_malloc(block_size * block_size * sizeof(*plane));
  block =
      (float *)aom_memalign(32, 2 * block_size * block_size * sizeof(*block));
  block_d = (double *)aom_malloc(block_size * block_size * sizeof(*block_d));
  plane_d = (double *)aom_malloc(block_size * block_size * sizeof(*plane_d));
  window_full = get_half_cos_window(block_size);
  tx_full = aom_noise_tx_malloc(block_size);

  if (chroma_sub[0] != 0) {
    init_success &= aom_flat_block_finder_init(&block_finder_chroma,
                                               block_size >> chroma_sub[0],
                                               bit_depth, use_highbd);
    window_chroma = get_half_cos_window(block_size >> chroma_sub[0]);
    tx_chroma = aom_noise_tx_malloc(block_size >> chroma_sub[0]);
  } else {
    window_chroma = window_full;
    tx_chroma = tx_full;
  }

  init_success &= (tx_full != NULL) && (tx_chroma != NULL) && (plane != NULL) &&
                  (plane_d != NULL) && (block != NULL) && (block_d != NULL) &&
                  (window_full != NULL) && (window_chroma != NULL) &&
                  (result != NULL);
  for (int c = init_success ? 0 : 3; c < 3; ++c) {
    float *window_function = c == 0 ? window_full : window_chroma;
    aom_flat_block_finder_t *block_finder = &block_finder_full;
    const int chroma_sub_h = c > 0 ? chroma_sub[1] : 0;
    const int chroma_sub_w = c > 0 ? chroma_sub[0] : 0;
    struct aom_noise_tx_t *tx =
        (c > 0 && chroma_sub[0] > 0) ? tx_chroma : tx_full;
    if (!data[c] || !denoised[c]) continue;
    if (c > 0 && chroma_sub[0] != 0) {
      block_finder = &block_finder_chroma;
    }
    memset(result, 0, sizeof(*result) * result_stride * result_height);
    // Do overlapped block processing (half overlapped). The block rows can
    // easily be done in parallel
    for (int offsy = 0; offsy < (block_size >> chroma_sub_h);
         offsy += (block_size >> chroma_sub_h) / 2) {
      for (int offsx = 0; offsx < (block_size >> chroma_sub_w);
           offsx += (block_size >> chroma_sub_w) / 2) {
        // Pad the boundary when processing each block-set.
        for (int by = -1; by < num_blocks_h; ++by) {
          for (int bx = -1; bx < num_blocks_w; ++bx) {
            const int pixels_per_block =
                (block_size >> chroma_sub_w) * (block_size >> chroma_sub_h);
            aom_flat_block_finder_extract_block(
                block_finder, data[c], w >> chroma_sub_w, h >> chroma_sub_h,
                stride[c], bx * (block_size >> chroma_sub_w) + offsx,
                by * (block_size >> chroma_sub_h) + offsy, plane_d, block_d);
            for (int j = 0; j < pixels_per_block; ++j) {
              block[j] = (float)block_d[j];
              plane[j] = (float)plane_d[j];
            }
            pointwise_multiply(window_function, block, pixels_per_block);
            aom_noise_tx_forward(tx, block);
            aom_noise_tx_filter(tx, noise_psd[c]);
            aom_noise_tx_inverse(tx, block);

            // Apply window function to the plane approximation (we will apply
            // it to the sum of plane + block when composing the results).
            pointwise_multiply(window_function, plane, pixels_per_block);

            for (int y = 0; y < (block_size >> chroma_sub_h); ++y) {
              const int y_result =
                  y + (by + 1) * (block_size >> chroma_sub_h) + offsy;
              for (int x = 0; x < (block_size >> chroma_sub_w); ++x) {
                const int x_result =
                    x + (bx + 1) * (block_size >> chroma_sub_w) + offsx;
                result[y_result * result_stride + x_result] +=
                    (block[y * (block_size >> chroma_sub_w) + x] +
                     plane[y * (block_size >> chroma_sub_w) + x]) *
                    window_function[y * (block_size >> chroma_sub_w) + x];
              }
            }
          }
        }
      }
    }
    if (use_highbd) {
      dither_and_quantize_highbd(result, result_stride, (uint16_t *)denoised[c],
                                 w, h, stride[c], chroma_sub_w, chroma_sub_h,
                                 block_size, kBlockNormalization);
    } else {
      dither_and_quantize_lowbd(result, result_stride, denoised[c], w, h,
                                stride[c], chroma_sub_w, chroma_sub_h,
                                block_size, kBlockNormalization);
    }
  }
  aom_free(result);
  aom_free(plane);
  aom_free(block);
  aom_free(plane_d);
  aom_free(block_d);
  aom_free(window_full);

  aom_noise_tx_free(tx_full);

  aom_flat_block_finder_free(&block_finder_full);
  if (chroma_sub[0] != 0) {
    aom_flat_block_finder_free(&block_finder_chroma);
    aom_free(window_chroma);
    aom_noise_tx_free(tx_chroma);
  }
  return init_success;
}